

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Vrc6.cpp
# Opt level: O2

void __thiscall Nes_Vrc6::write_osc(Nes_Vrc6 *this,cpu_time_t time,int osc_index,int reg,int data)

{
  uint __line;
  char *__assertion;
  
  if ((uint)osc_index < 3) {
    if ((uint)reg < 3) {
      run_until(this,time);
      this->oscs[(uint)osc_index].regs[(uint)reg] = (uint8_t)data;
      return;
    }
    __assertion = "( \"unmet requirement\", (unsigned) reg < reg_count )";
    __line = 0x4c;
  }
  else {
    __assertion = "( \"unmet requirement\", (unsigned) osc_index < osc_count )";
    __line = 0x4b;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/fgssfgss[P]NESEmulator/apu_emu/nes_apu/Nes_Vrc6.cpp"
                ,__line,"void Nes_Vrc6::write_osc(cpu_time_t, int, int, int)");
}

Assistant:

void Nes_Vrc6::write_osc( cpu_time_t time, int osc_index, int reg, int data )
{
	require( (unsigned) osc_index < osc_count );
	require( (unsigned) reg < reg_count );
	
	run_until( time );
	oscs [osc_index].regs [reg] = data;
}